

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

TestNode * __thiscall xe::TestNode::find(TestNode *this,char *path)

{
  TestNodeType TVar1;
  bool bVar2;
  uint compLen;
  TestNode *pTVar3;
  Error *this_00;
  
  TVar1 = this->m_nodeType;
  if (TVar1 == TESTNODETYPE_ROOT) {
LAB_0011c343:
    pTVar3 = TestGroup::findChildNode((TestGroup *)this,path);
    return pTVar3;
  }
  compLen = getFirstComponentLength(path);
  if ((int)compLen < 1) {
    this_00 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(this_00,(char *)0x0,"compLen > 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                 ,0x9d);
    __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = compareNameToPathComponent((this->m_name)._M_dataplus._M_p,path,compLen);
  if (bVar2) {
    if (path[compLen] == '\0') {
      return this;
    }
    if (TVar1 == TESTNODETYPE_GROUP) {
      path = path + (ulong)compLen + 1;
      goto LAB_0011c343;
    }
  }
  return (TestNode *)0x0;
}

Assistant:

const TestNode* TestNode::find (const char* path) const
{
	if (m_nodeType == TESTNODETYPE_ROOT)
	{
		// Don't need to consider current node.
		return static_cast<const TestGroup*>(this)->findChildNode(path);
	}
	else
	{
		// Check if first component matches this node.
		int compLen = getFirstComponentLength(path);
		XE_CHECK(compLen > 0);

		if (compareNameToPathComponent(getName(), path, compLen))
		{
			if (path[compLen] == 0)
				return this;
			else if (getNodeType() == TESTNODETYPE_GROUP)
				return static_cast<const TestGroup*>(this)->findChildNode(path + compLen + 1);
			else
				return DE_NULL;
		}
		else
			return DE_NULL;
	}
}